

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * RemapInstructionArgument
                    (ExpressionContext *ctx,VmModule *module,VmValue *argOrig,
                    SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>
                    *variableRemap,
                    SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>
                    *instructionRemap)

{
  uint uVar1;
  VariableData *pVVar2;
  int iVar3;
  VmConstant **ppVVar4;
  undefined4 extraout_var;
  VmInstruction **ppVVar5;
  char *pcVar6;
  VariableData *containerOrig;
  VmConstant *reference;
  VmConstant *this;
  
  if (argOrig == (VmValue *)0x0) {
LAB_0025942c:
    __assert_fail("!\"unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x19b2,
                  "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
                 );
  }
  uVar1 = argOrig->typeID;
  reference = (VmConstant *)argOrig;
  if (uVar1 == 1) {
    containerOrig = (VariableData *)argOrig[1].comment.end;
    if ((containerOrig != (VariableData *)0x0) &&
       (ppVVar4 = SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::find
                            (variableRemap,&containerOrig), ppVVar4 != (VmConstant **)0x0)) {
      if (argOrig[1].hasMemoryAccess == true) {
        iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
        this = (VmConstant *)CONCAT44(extraout_var,iVar3);
        VmConstant::VmConstant(this,ctx->allocator,argOrig->type,argOrig->source);
        this->iValue = *(int *)&argOrig[1]._vptr_VmValue;
        pVVar2 = (*ppVVar4)->container;
        this->container = pVVar2;
        this->isReference = true;
        reference = this;
        SmallArray<VmConstant_*,_8U>::push_back(&pVVar2->users,&reference);
        pcVar6 = (argOrig->comment).begin;
      }
      else {
        reference = CreateConstantPointer
                              (ctx->allocator,argOrig->source,*(int *)&argOrig[1]._vptr_VmValue,
                               (*ppVVar4)->container,(argOrig->type).structType,true);
        pcVar6 = (argOrig->comment).begin;
      }
      if (pcVar6 != (argOrig->comment).end) {
        pcVar6 = (argOrig->comment).end;
        (((VmInstruction *)reference)->super_VmValue).comment.begin = (argOrig->comment).begin;
        (((VmInstruction *)reference)->super_VmValue).comment.end = pcVar6;
      }
    }
  }
  else if (uVar1 != 4) {
    if (uVar1 != 2) goto LAB_0025942c;
    containerOrig = (VariableData *)argOrig;
    ppVVar5 = SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::find
                        (instructionRemap,(VmInstruction **)&containerOrig);
    if (ppVVar5 == (VmInstruction **)0x0) {
      __assert_fail("remap",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x19a9,
                    "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
                   );
    }
    reference = (VmConstant *)*ppVVar5;
  }
  return &((VmInstruction *)reference)->super_VmValue;
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}